

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::base::
CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
::Grow(CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
       *this,size_t new_capacity)

{
  undefined8 *puVar1;
  _Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  _Var2;
  code *pcVar3;
  pointer ppVar4;
  pointer __p;
  char *fname;
  uint *puVar5;
  char *pcVar6;
  long lVar7;
  int line;
  ulong uVar8;
  uint __errnum;
  ulong uVar9;
  char *pcVar10;
  uint64_t uVar11;
  ulong n_membs;
  uint64_t uVar12;
  pointer local_30;
  
  n_membs = this->capacity_ * 2;
  if (new_capacity != 0) {
    n_membs = new_capacity;
  }
  if ((n_membs & n_membs - 1) == 0) {
    if (this->capacity_ < n_membs) {
      AlignedAllocTyped<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>[]>
                ((base *)&local_30,n_membs);
      uVar11 = this->begin_;
      lVar7 = 0x10;
      uVar12 = 0;
      while( true ) {
        uVar9 = uVar11 + uVar12;
        uVar8 = this->end_;
        if (uVar8 <= uVar9) break;
        _Var2._M_head_impl =
             (this->entries_)._M_t.
             super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
             ._M_head_impl;
        uVar9 = this->capacity_ - 1 & uVar9;
        uVar12 = uVar12 + 1;
        ppVar4 = *(pointer *)
                  ((long)&_Var2._M_head_impl[uVar9].
                          super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  + 8);
        puVar1 = (undefined8 *)((long)local_30 + lVar7 + -0x10);
        *puVar1 = *(undefined8 *)
                   &_Var2._M_head_impl[uVar9].
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
        ;
        puVar1[1] = ppVar4;
        *(pointer *)
         ((long)&(local_30->
                 super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar7) =
             *(pointer *)((long)(_Var2._M_head_impl + uVar9) + 0x10);
        *(undefined8 *)
         &_Var2._M_head_impl[uVar9].
          super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             = 0;
        *(pointer *)
         ((long)&_Var2._M_head_impl[uVar9].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
         + 8) = (pointer)0x0;
        *(pointer *)((long)(_Var2._M_head_impl + uVar9) + 0x10) = (pointer)0x0;
        lVar7 = lVar7 + 0x18;
      }
      for (uVar11 = this->begin_; __p = local_30, uVar11 < uVar8; uVar11 = uVar11 + 1) {
        std::
        _Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
        ::~_Vector_base(&(this->entries_)._M_t.
                         super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
                         ._M_head_impl[this->capacity_ - 1 & uVar11].
                         super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                       );
        uVar8 = this->end_;
      }
      this->begin_ = 0;
      this->end_ = uVar12;
      this->capacity_ = n_membs;
      local_30 = (pointer)0x0;
      std::
      __uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
      ::reset((__uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
               *)this,__p);
      free(local_30);
      return;
    }
    fname = Basename(
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
    puVar5 = (uint *)__errno_location();
    __errnum = *puVar5;
    pcVar6 = strerror(__errnum);
    pcVar10 = "PERFETTO_CHECK(new_capacity > capacity_)";
    line = 0xc6fd;
  }
  else {
    fname = Basename(
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
    puVar5 = (uint *)__errno_location();
    __errnum = *puVar5;
    pcVar6 = strerror(__errnum);
    pcVar10 = "PERFETTO_CHECK((new_capacity & (new_capacity - 1)) == 0)";
    line = 0xc6f9;
  }
  LogMessage(kLogError,fname,line,"%s (errno: %d, %s)",pcVar10,(ulong)__errnum,pcVar6);
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void Grow(size_t new_capacity = 0) {
    // Capacity must be always a power of two. This allows Get() to use a simple
    // bitwise-AND for handling the wrapping instead of a full division.
    new_capacity = new_capacity ? new_capacity : capacity_ * 2;
    PERFETTO_CHECK((new_capacity & (new_capacity - 1)) == 0);  // Must be pow2.

    // On 32-bit systems this might hit the 4GB wall and overflow. We can't do
    // anything other than crash in this case.
    PERFETTO_CHECK(new_capacity > capacity_);

    AlignedUniquePtr<T[]> new_vec = AlignedAllocTyped<T[]>(new_capacity);

    // Move all elements in the expanded array.
    size_t new_size = 0;
    for (uint64_t i = begin_; i < end_; i++)
      new (&new_vec[new_size++]) T(std::move(*Get(i)));  // Placement move ctor.

    // Even if all the elements are std::move()-d and likely empty, we are still
    // required to call the dtor for them.
    for (uint64_t i = begin_; i < end_; i++)
      Get(i)->~T();

    begin_ = 0;
    end_ = new_size;
    capacity_ = new_capacity;
    entries_ = std::move(new_vec);
  }